

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O3

int effectiveTextMargin(int defaultMargin,SideWidgetEntryList *widgets,
                       SideWidgetParameters *parameters)

{
  bool bVar1;
  QWidget *this;
  long in_RCX;
  int iVar2;
  
  if ((SideWidgetParameters *)widgets != parameters) {
    iVar2 = 0;
    do {
      this = (QWidget *)QMetaObject::cast((QObject *)&QLineEditIconButton::staticMetaObject);
      if (this == (QWidget *)0x0) {
        this = (QWidget *)
               (widgets->
               super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
               )._M_impl.super__Vector_impl_data._M_start;
LAB_00421888:
        bVar1 = QWidget::isVisibleTo(this,*(QWidget **)(*(long *)&this->field_0x8 + 0x10));
        iVar2 = iVar2 + (uint)bVar1;
      }
      else if (this[1].field_0x9 == '\0') goto LAB_00421888;
      widgets = widgets + 1;
    } while ((SideWidgetParameters *)widgets != parameters);
    defaultMargin = defaultMargin + (*(int *)(in_RCX + 4) + *(int *)(in_RCX + 0xc)) * iVar2;
  }
  return defaultMargin;
}

Assistant:

static int effectiveTextMargin(int defaultMargin, const QLineEditPrivate::SideWidgetEntryList &widgets,
                               const QLineEditPrivate::SideWidgetParameters &parameters)
{
    if (widgets.empty())
        return defaultMargin;

    const auto visibleSideWidgetCount = std::count_if(widgets.begin(), widgets.end(),
                             [](const QLineEditPrivate::SideWidgetEntry &e) {
#if QT_CONFIG(toolbutton) && QT_CONFIG(animation)
        // a button that's fading out doesn't get any space
        if (auto* iconButton = qobject_cast<QLineEditIconButton*>(e.widget))
            return iconButton->needsSpace();

#endif
        return e.widget->isVisibleTo(e.widget->parentWidget());
    });

    return defaultMargin + (parameters.margin + parameters.widgetWidth) * visibleSideWidgetCount;
}